

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpipe.cpp
# Opt level: O2

int __thiscall TokenPipeEnd::TokenRead(TokenPipeEnd *this)

{
  ssize_t sVar1;
  int *piVar2;
  uint uVar3;
  long in_FS_OFFSET;
  uint8_t token;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xffffffff;
  do {
    sVar1 = ::read(this->m_fd,&token,1);
    if (-1 < sVar1) {
      if (sVar1 == 0) {
        uVar3 = 0xfffffffe;
      }
      else {
        uVar3 = (uint)token;
      }
      break;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

int TokenPipeEnd::TokenRead()
{
    uint8_t token;
    while (true) {
        ssize_t result = read(m_fd, &token, 1);
        if (result < 0) {
            // Failure. Check if the read was interrupted by a signal,
            // in that case retry.
            if (errno != EINTR) {
                return TS_ERR;
            }
        } else if (result == 0) {
            return TS_EOS;
        } else { // ==1
            return token;
        }
    }
    return token;
}